

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputlag.c
# Opt level: O0

int main(int argc,char **argv)

{
  nk_font_atlas *ctx;
  int iVar1;
  GLFWvidmode *pGVar2;
  nk_command_buffer *canvas_00;
  nk_vec2 nVar3;
  undefined1 auVar4 [16];
  nk_rect nVar5;
  uint local_bc;
  int lead;
  nk_command_buffer *canvas;
  undefined4 uStack_a8;
  nk_flags align_left;
  nk_rect nStack_a0;
  nk_rect area;
  int height_1;
  int width_1;
  GLFWvidmode *mode;
  int show_forecasts;
  nk_font_atlas *atlas;
  nk_context *nk;
  GLFWwindow *window;
  GLFWmonitor *monitor;
  double dStack_48;
  int fullscreen;
  double frame_rate;
  double current_time;
  double last_time;
  unsigned_long frame_count;
  int local_20;
  int height;
  int width;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  last_time = 0.0;
  dStack_48 = 0.0;
  monitor._4_4_ = 0;
  window = (GLFWwindow *)0x0;
  mode._4_4_ = 1;
  _width = argv;
  argv_local._0_4_ = argc;
  while (height = getopt((int)argv_local,_width,"fh"), height != -1) {
    if (height == 0x66) {
      monitor._4_4_ = 1;
    }
    else if (height == 0x68) {
      usage();
      exit(0);
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  if (monitor._4_4_ == 0) {
    local_20 = 0x280;
    frame_count._4_4_ = 0x1e0;
  }
  else {
    window = (GLFWwindow *)glfwGetPrimaryMonitor();
    pGVar2 = glfwGetVideoMode((GLFWmonitor *)window);
    local_20 = pGVar2->width;
    frame_count._4_4_ = pGVar2->height;
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  glfwWindowHint(0x2200c,1);
  nk = (nk_context *)
       glfwCreateWindow(local_20,frame_count._4_4_,"Input lag test",(GLFWmonitor *)window,
                        (GLFWwindow *)0x0);
  if (nk != (nk_context *)0x0) {
    glfwMakeContextCurrent((GLFWwindow *)nk);
    gladLoadGLLoader(glfwGetProcAddress);
    update_vsync();
    current_time = glfwGetTime();
    atlas = (nk_font_atlas *)nk_glfw3_init((GLFWwindow *)nk,NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin((nk_font_atlas **)&stack0xffffffffffffff90);
    nk_glfw3_font_stash_end();
    glfwSetKeyCallback((GLFWwindow *)nk,key_callback);
    glfwSetCursorPosCallback((GLFWwindow *)nk,cursor_pos_callback);
    while (iVar1 = glfwWindowShouldClose((GLFWwindow *)nk), iVar1 == 0) {
      glfwPollEvents();
      sample_input((GLFWwindow *)nk);
      glfwGetWindowSize((GLFWwindow *)nk,(int *)&area.h,(int *)&area.w);
      nVar5 = nk_rect(0.0,0.0,(float)(int)area.h,(float)(int)area.w);
      _uStack_a8 = nVar5._0_8_;
      nStack_a0._0_8_ = nVar5._8_8_;
      area.x = nStack_a0.x;
      area.y = nStack_a0.y;
      (*glad_glClear)(0x4000);
      nk_glfw3_new_frame();
      nVar5.w = area.x;
      nVar5.h = area.y;
      nVar5.x = (float)uStack_a8;
      nVar5.y = (float)align_left;
      iVar1 = nk_begin((nk_context *)atlas,"",nVar5,0);
      if (iVar1 != 0) {
        canvas_00 = nk_window_get_canvas((nk_context *)atlas);
        local_bc = 0;
        if (mode._4_4_ != 0) {
          local_bc = 3;
        }
        for (; -1 < (int)local_bc; local_bc = local_bc + -1) {
          nVar3 = nk_vec2(cursor_vel.x * (float)(int)local_bc + cursor_pos.x,
                          cursor_vel.y * (float)(int)local_bc + cursor_pos.y);
          draw_marker(canvas_00,local_bc,nVar3);
        }
        nk_layout_row_dynamic((nk_context *)atlas,20.0,1);
        nk_label((nk_context *)atlas,"Move mouse uniformly and check marker under cursor:",0x11);
        for (local_bc = 0; (int)local_bc < 4; local_bc = local_bc + 1) {
          nk_layout_row_begin((nk_context *)atlas,NK_STATIC,12.0,2);
          nk_layout_row_push((nk_context *)atlas,25.0);
          ctx = atlas;
          nVar3 = nk_vec2(20.0,5.0);
          nVar3 = nk_layout_space_to_screen((nk_context *)ctx,nVar3);
          draw_marker(canvas_00,local_bc,nVar3);
          nk_label((nk_context *)atlas,"",0);
          nk_layout_row_push((nk_context *)atlas,500.0);
          if (local_bc == 0) {
            nk_label((nk_context *)atlas,"- current cursor position (no input lag)",0x11);
          }
          else {
            nk_labelf((nk_context *)atlas,0x11,"- %d-frame forecast (input lag is %d frame)",
                      (ulong)local_bc,(ulong)local_bc);
          }
          nk_layout_row_end((nk_context *)atlas);
        }
        nk_layout_row_dynamic((nk_context *)atlas,20.0,1);
        nk_checkbox_label((nk_context *)atlas,"Show forecasts",(int *)((long)&mode + 4));
        nk_label((nk_context *)atlas,"Input method:",0x11);
        iVar1 = nk_option_label((nk_context *)atlas,"glfwGetCursorPos (sync query)",
                                (uint)(cursor_method == NK_DO_NOT_STOP_ON_NEW_LINE));
        if (iVar1 != 0) {
          cursor_method = NK_DO_NOT_STOP_ON_NEW_LINE;
        }
        iVar1 = nk_option_label((nk_context *)atlas,
                                "glfwSetCursorPosCallback (latest input message)",
                                (uint)(cursor_method == NK_STOP_ON_NEW_LINE));
        if (iVar1 != 0) {
          cursor_method = NK_STOP_ON_NEW_LINE;
        }
        nk_label((nk_context *)atlas,"",0);
        nk_value_float((nk_context *)atlas,"FPS",(float)dStack_48);
        iVar1 = nk_checkbox_label((nk_context *)atlas,"Enable vsync",&enable_vsync);
        if (iVar1 != 0) {
          update_vsync();
        }
        nk_label((nk_context *)atlas,"",0);
        nk_label((nk_context *)atlas,"After swap:",0x11);
        nk_checkbox_label((nk_context *)atlas,"glClear",&swap_clear);
        nk_checkbox_label((nk_context *)atlas,"glFinish",&swap_finish);
        nk_checkbox_label((nk_context *)atlas,"draw with occlusion query",&swap_occlusion_query);
        nk_checkbox_label((nk_context *)atlas,"glReadPixels",&swap_read_pixels);
      }
      nk_end((nk_context *)atlas);
      nk_glfw3_render(NK_ANTI_ALIASING_ON);
      swap_buffers((GLFWwindow *)nk);
      last_time = (double)((long)last_time + 1);
      frame_rate = glfwGetTime();
      if (1.0 < frame_rate - current_time) {
        auVar4._8_4_ = (int)((ulong)last_time >> 0x20);
        auVar4._0_8_ = last_time;
        auVar4._12_4_ = 0x45300000;
        dStack_48 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(last_time,0)) - 4503599627370496.0)) /
                    (frame_rate - current_time);
        last_time = 0.0;
        current_time = frame_rate;
      }
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    unsigned long frame_count = 0;
    double last_time, current_time;
    double frame_rate = 0;
    int fullscreen = GLFW_FALSE;
    GLFWmonitor* monitor = NULL;
    GLFWwindow* window;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    int show_forecasts = nk_true;

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen)
    {
        const GLFWvidmode* mode;

        monitor = glfwGetPrimaryMonitor();
        mode = glfwGetVideoMode(monitor);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width = 640;
        height = 480;
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(width, height, "Input lag test", monitor, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    update_vsync();

    last_time = glfwGetTime();

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    glfwSetKeyCallback(window, key_callback);
    glfwSetCursorPosCallback(window, cursor_pos_callback);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        struct nk_rect area;

        glfwPollEvents();
        sample_input(window);

        glfwGetWindowSize(window, &width, &height);
        area = nk_rect(0.f, 0.f, (float) width, (float) height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();
        if (nk_begin(nk, "", area, 0))
        {
            nk_flags align_left = NK_TEXT_ALIGN_LEFT | NK_TEXT_ALIGN_MIDDLE;
            struct nk_command_buffer *canvas = nk_window_get_canvas(nk);
            int lead;

            for (lead = show_forecasts ? 3 : 0; lead >= 0; lead--)
                draw_marker(canvas, lead, nk_vec2(cursor_pos.x + cursor_vel.x * lead,
                                                  cursor_pos.y + cursor_vel.y * lead));

            // print instructions
            nk_layout_row_dynamic(nk, 20, 1);
            nk_label(nk, "Move mouse uniformly and check marker under cursor:", align_left);
            for (lead = 0; lead <= 3; lead++) {
                nk_layout_row_begin(nk, NK_STATIC, 12, 2);
                nk_layout_row_push(nk, 25);
                draw_marker(canvas, lead, nk_layout_space_to_screen(nk, nk_vec2(20, 5)));
                nk_label(nk, "", 0);
                nk_layout_row_push(nk, 500);
                if (lead == 0)
                    nk_label(nk, "- current cursor position (no input lag)", align_left);
                else
                    nk_labelf(nk, align_left, "- %d-frame forecast (input lag is %d frame)", lead, lead);
                nk_layout_row_end(nk);
            }

            nk_layout_row_dynamic(nk, 20, 1);

            nk_checkbox_label(nk, "Show forecasts", &show_forecasts);
            nk_label(nk, "Input method:", align_left);
            if (nk_option_label(nk, "glfwGetCursorPos (sync query)", cursor_method == cursor_sync_query))
                cursor_method = cursor_sync_query;
            if (nk_option_label(nk, "glfwSetCursorPosCallback (latest input message)", cursor_method == cursor_input_message))
                cursor_method = cursor_input_message;

            nk_label(nk, "", 0); // separator

            nk_value_float(nk, "FPS", (float) frame_rate);
            if (nk_checkbox_label(nk, "Enable vsync", &enable_vsync))
                update_vsync();

            nk_label(nk, "", 0); // separator

            nk_label(nk, "After swap:", align_left);
            nk_checkbox_label(nk, "glClear", &swap_clear);
            nk_checkbox_label(nk, "glFinish", &swap_finish);
            nk_checkbox_label(nk, "draw with occlusion query", &swap_occlusion_query);
            nk_checkbox_label(nk, "glReadPixels", &swap_read_pixels);
        }

        nk_end(nk);
        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        swap_buffers(window);

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}